

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<std::pair<QTreeWidgetItem_*,_int>_>::begin(QList<std::pair<QTreeWidgetItem_*,_int>_> *this)

{
  pair<QTreeWidgetItem_*,_int> *n;
  QArrayDataPointer<std::pair<QTreeWidgetItem_*,_int>_> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QTreeWidgetItem_*,_int>_> *)0x91c179);
  QArrayDataPointer<std::pair<QTreeWidgetItem_*,_int>_>::operator->(in_RDI);
  n = QArrayDataPointer<std::pair<QTreeWidgetItem_*,_int>_>::begin
                ((QArrayDataPointer<std::pair<QTreeWidgetItem_*,_int>_> *)0x91c18a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }